

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O0

void de::BlockBufferBasicTest::runTest(void)

{
  bool bVar1;
  int numBlocks_00;
  int blockSize_00;
  int numProducers_00;
  int iVar2;
  uint numMessages;
  deUint32 dVar3;
  deBool dVar4;
  Producer *this;
  Consumer *this_00;
  reference ppCVar5;
  reference ppPVar6;
  reference ppCVar7;
  ulong in_RCX;
  __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
  local_190;
  __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
  local_188;
  iterator i_10;
  __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
  local_178;
  __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
  local_170;
  iterator i_9;
  int local_160;
  int j;
  deUint32 cmpSum;
  int i_8;
  int i_7;
  deUint32 refSum;
  __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
  local_148;
  __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
  local_140;
  iterator i_6;
  int i_5;
  Message endMsg;
  __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
  local_128;
  __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
  local_120;
  iterator i_4;
  __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
  local_110;
  __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
  local_108;
  iterator i_3;
  __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
  local_f8;
  __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
  local_f0;
  iterator i_2;
  int local_dc;
  Producer *pPStack_d8;
  int i_1;
  int local_cc;
  undefined1 local_c8 [4];
  int i;
  vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
  consumers;
  vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
  producers;
  MessageBuffer buffer;
  int dataSize;
  int numConsumers;
  int numProducers;
  int blockSize;
  undefined1 local_20 [4];
  int numBlocks;
  Random rnd;
  int iterNdx;
  int numIterations;
  
  rnd.m_rnd.w = 8;
  for (rnd.m_rnd.z = 0; (int)rnd.m_rnd.z < 8; rnd.m_rnd.z = rnd.m_rnd.z + 1) {
    Random::Random((Random *)local_20,rnd.m_rnd.z);
    numBlocks_00 = Random::getInt((Random *)local_20,2,0x80);
    blockSize_00 = Random::getInt((Random *)local_20,1,0x10);
    numProducers_00 = Random::getInt((Random *)local_20,1,0x10);
    iVar2 = Random::getInt((Random *)local_20,1,0x10);
    numMessages = Random::getInt((Random *)local_20,0x32,200);
    BlockBuffer<de::BlockBufferBasicTest::Message>::BlockBuffer
              ((BlockBuffer<de::BlockBufferBasicTest::Message> *)
               &producers.
                super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,blockSize_00,numBlocks_00);
    std::
    vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
    ::vector((vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
              *)&consumers.
                 super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
    ::vector((vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
              *)local_c8);
    for (local_cc = 0; local_cc < numProducers_00; local_cc = local_cc + 1) {
      this = (Producer *)operator_new(0x28);
      in_RCX = (ulong)numMessages;
      Producer::Producer(this,(MessageBuffer *)
                              &producers.
                               super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(deUint16)local_cc
                         ,numMessages);
      pPStack_d8 = this;
      std::
      vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
      ::push_back((vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                   *)&consumers.
                      super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&stack0xffffffffffffff28);
    }
    for (local_dc = 0; local_dc < iVar2; local_dc = local_dc + 1) {
      this_00 = (Consumer *)operator_new(0x50);
      Consumer::Consumer(this_00,(MessageBuffer *)
                                 &producers.
                                  super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,numProducers_00
                        );
      i_2._M_current = (Consumer **)this_00;
      std::
      vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
      ::push_back((vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                   *)local_c8,(value_type *)&i_2);
    }
    local_f0._M_current =
         (Consumer **)
         std::
         vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
         ::begin((vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                  *)local_c8);
    while( true ) {
      local_f8._M_current =
           (Consumer **)
           std::
           vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
           ::end((vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                  *)local_c8);
      bVar1 = __gnu_cxx::operator!=(&local_f0,&local_f8);
      if (!bVar1) break;
      ppCVar7 = __gnu_cxx::
                __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
                ::operator*(&local_f0);
      Thread::start(&(*ppCVar7)->super_Thread);
      i_3._M_current =
           (Producer **)
           __gnu_cxx::
           __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
           ::operator++(&local_f0,0);
    }
    local_108._M_current =
         (Producer **)
         std::
         vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
         ::begin((vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                  *)&consumers.
                     super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_110._M_current =
           (Producer **)
           std::
           vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
           ::end((vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                  *)&consumers.
                     super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&local_108,&local_110);
      if (!bVar1) break;
      ppPVar6 = __gnu_cxx::
                __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
                ::operator*(&local_108);
      Thread::start(&(*ppPVar6)->super_Thread);
      i_4._M_current =
           (Producer **)
           __gnu_cxx::
           __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
           ::operator++(&local_108,0);
    }
    local_120._M_current =
         (Producer **)
         std::
         vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
         ::begin((vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                  *)&consumers.
                     super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_128._M_current =
           (Producer **)
           std::
           vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
           ::end((vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                  *)&consumers.
                     super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&local_120,&local_128);
      if (!bVar1) break;
      ppPVar6 = __gnu_cxx::
                __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
                ::operator*(&local_120);
      Thread::join(&(*ppPVar6)->super_Thread);
      __gnu_cxx::
      __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
      ::operator++(&local_120,0);
    }
    Message::Message((Message *)((long)&i_6._M_current + 4),0xffff,0);
    for (i_6._M_current._0_4_ = 0; (int)i_6._M_current < iVar2;
        i_6._M_current._0_4_ = (int)i_6._M_current + 1) {
      BlockBuffer<de::BlockBufferBasicTest::Message>::write
                ((BlockBuffer<de::BlockBufferBasicTest::Message> *)
                 &producers.
                  super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,1,
                 (void *)((long)&i_6._M_current + 4),in_RCX);
    }
    BlockBuffer<de::BlockBufferBasicTest::Message>::flush
              ((BlockBuffer<de::BlockBufferBasicTest::Message> *)
               &producers.
                super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_140._M_current =
         (Consumer **)
         std::
         vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
         ::begin((vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                  *)local_c8);
    while( true ) {
      local_148._M_current =
           (Consumer **)
           std::
           vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
           ::end((vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                  *)local_c8);
      bVar1 = __gnu_cxx::operator!=(&local_140,&local_148);
      if (!bVar1) break;
      ppCVar7 = __gnu_cxx::
                __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
                ::operator*(&local_140);
      Thread::join(&(*ppCVar7)->super_Thread);
      __gnu_cxx::
      __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
      ::operator++(&local_140,0);
    }
    i_8 = 0;
    for (cmpSum = 0; (int)cmpSum < (int)numMessages; cmpSum = cmpSum + 1) {
      i_8 = (cmpSum & 0xffff) + i_8;
    }
    for (j = 0; j < numProducers_00; j = j + 1) {
      local_160 = 0;
      for (i_9._M_current._4_4_ = 0; i_9._M_current._4_4_ < iVar2;
          i_9._M_current._4_4_ = i_9._M_current._4_4_ + 1) {
        ppCVar5 = std::
                  vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                  ::operator[]((vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                                *)local_c8,(long)i_9._M_current._4_4_);
        dVar3 = Consumer::getPayloadSum(*ppCVar5,(deUint16)j);
        local_160 = dVar3 + local_160;
      }
      do {
        dVar4 = ::deGetFalse();
        in_RCX = 0;
        if (dVar4 != 0 || i_8 != local_160) {
          deAssertFail("refSum == cmpSum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deBlockBuffer.cpp"
                       ,0xd4);
        }
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
    }
    local_170._M_current =
         (Producer **)
         std::
         vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
         ::begin((vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                  *)&consumers.
                     super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_178._M_current =
           (Producer **)
           std::
           vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
           ::end((vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                  *)&consumers.
                     super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&local_170,&local_178);
      if (!bVar1) break;
      ppPVar6 = __gnu_cxx::
                __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
                ::operator*(&local_170);
      if (*ppPVar6 != (Producer *)0x0) {
        (*((*ppPVar6)->super_Thread)._vptr_Thread[1])();
      }
      i_10._M_current =
           (Consumer **)
           __gnu_cxx::
           __normal_iterator<de::BlockBufferBasicTest::Producer_**,_std::vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>_>
           ::operator++(&local_170,0);
    }
    local_188._M_current =
         (Consumer **)
         std::
         vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
         ::begin((vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                  *)local_c8);
    while( true ) {
      local_190._M_current =
           (Consumer **)
           std::
           vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
           ::end((vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                  *)local_c8);
      bVar1 = __gnu_cxx::operator!=(&local_188,&local_190);
      if (!bVar1) break;
      ppCVar7 = __gnu_cxx::
                __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
                ::operator*(&local_188);
      if (*ppCVar7 != (Consumer *)0x0) {
        (*((*ppCVar7)->super_Thread)._vptr_Thread[1])();
      }
      __gnu_cxx::
      __normal_iterator<de::BlockBufferBasicTest::Consumer_**,_std::vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>_>
      ::operator++(&local_188,0);
    }
    std::
    vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
    ::~vector((vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
               *)local_c8);
    std::
    vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
    ::~vector((vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
               *)&consumers.
                  super__Vector_base<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    BlockBuffer<de::BlockBufferBasicTest::Message>::~BlockBuffer
              ((BlockBuffer<de::BlockBufferBasicTest::Message> *)
               &producers.
                super__Vector_base<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Random::~Random((Random *)local_20);
  }
  return;
}

Assistant:

void runTest (void)
{
	const int numIterations = 8;
	for (int iterNdx = 0; iterNdx < numIterations; iterNdx++)
	{
		Random							rnd				(iterNdx);
		int								numBlocks		= rnd.getInt(2, 128);
		int								blockSize		= rnd.getInt(1, 16);
		int								numProducers	= rnd.getInt(1, 16);
		int								numConsumers	= rnd.getInt(1, 16);
		int								dataSize		= rnd.getInt(50, 200);
		MessageBuffer					buffer			(blockSize, numBlocks);
		vector<Producer*>				producers;
		vector<Consumer*>				consumers;

		for (int i = 0; i < numProducers; i++)
			producers.push_back(new Producer(buffer, (deUint16)i, dataSize));

		for (int i = 0; i < numConsumers; i++)
			consumers.push_back(new Consumer(buffer, numProducers));

		// Start consumers.
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			(*i)->start();

		// Start producers.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			(*i)->start();

		// Wait for producers.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			(*i)->join();

		// Write end messages for consumers.
		const Message endMsg(0xffff, 0);
		for (int i = 0; i < numConsumers; i++)
			buffer.write(1, &endMsg);
		buffer.flush();

		// Wait for consumers.
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			(*i)->join();

		// Verify payload sums.
		deUint32 refSum = 0;
		for (int i = 0; i < dataSize; i++)
			refSum += (deUint32)(deUint16)i;

		for (int i = 0; i < numProducers; i++)
		{
			deUint32 cmpSum = 0;
			for (int j = 0; j < numConsumers; j++)
				cmpSum += consumers[j]->getPayloadSum((deUint16)i);
			DE_TEST_ASSERT(refSum == cmpSum);
		}

		// Free resources.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			delete *i;
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			delete *i;
	}
}